

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

void __thiscall jbcoin::STPathSet::add(STPathSet *this,Serializer *s)

{
  uint uVar1;
  SField *pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  STPathElement *speElement;
  pointer pSVar6;
  STPath *spPath;
  pointer pSVar7;
  
  pSVar2 = (this->super_STBase).fName;
  if (0xff < pSVar2->fieldValue) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STPathSet.cpp"
                  ,0xc1,"virtual void jbcoin::STPathSet::add(Serializer &) const");
  }
  if (pSVar2->fieldType == STI_PATHSET) {
    pSVar3 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = true;
    for (pSVar7 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>.
                  _M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar3; pSVar7 = pSVar7 + 1) {
      if (!bVar5) {
        Serializer::add8(s,0xff);
      }
      pSVar4 = (pSVar7->mPath).
               super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pSVar6 = (pSVar7->mPath).
                    super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                    ._M_impl.super__Vector_impl_data._M_start; pSVar6 != pSVar4; pSVar6 = pSVar6 + 1
          ) {
        uVar1 = pSVar6->mType;
        Serializer::add8(s,(uchar)uVar1);
        if ((uVar1 & 1) != 0) {
          Serializer::addBitString<160,jbcoin::detail::AccountIDTag>(s,&pSVar6->mAccountID);
        }
        if ((uVar1 & 0x10) != 0) {
          Serializer::addBitString<160,jbcoin::detail::CurrencyTag>(s,&pSVar6->mCurrencyID);
        }
        if ((uVar1 & 0x20) != 0) {
          Serializer::addBitString<160,jbcoin::detail::AccountIDTag>(s,&pSVar6->mIssuerID);
        }
      }
      bVar5 = false;
    }
    Serializer::add8(s,'\0');
    return;
  }
  __assert_fail("fName->fieldType == STI_PATHSET",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STPathSet.cpp"
                ,0xc2,"virtual void jbcoin::STPathSet::add(Serializer &) const");
}

Assistant:

void
STPathSet::add (Serializer& s) const
{
    assert (fName->isBinary ());
    assert (fName->fieldType == STI_PATHSET);
    bool first = true;

    for (auto const& spPath : value)
    {
        if (!first)
            s.add8 (STPathElement::typeBoundary);

        for (auto const& speElement : spPath)
        {
            int iType = speElement.getNodeType ();

            s.add8 (iType);

            if (iType & STPathElement::typeAccount)
                s.add160 (speElement.getAccountID ());

            if (iType & STPathElement::typeCurrency)
                s.add160 (speElement.getCurrency ());

            if (iType & STPathElement::typeIssuer)
                s.add160 (speElement.getIssuerID ());
        }

        first = false;
    }

    s.add8 (STPathElement::typeNone);
}